

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetYProbabilitiesExactScopes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,Index *yIndex)

{
  CPDDiscreteInterface *pCVar1;
  Index IVar2;
  uint uVar3;
  size_type __n;
  ulong uVar4;
  double extraout_XMM0_Qa;
  allocator_type local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  value_type_conflict3 local_38;
  
  local_40 = Yii;
  __n = (**(code **)((long)*this->_m_madp + 0x1a8))(this->_m_madp,*yIndex);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,&local_38,&local_41);
  IVar2 = IndividualToJointYiiIndices(this,*yIndex,Xii,Aii,local_40);
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < __n; uVar3 = uVar3 + 1) {
    pCVar1 = (this->_m_Y_CPDs).
             super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*yIndex];
    (*pCVar1->_vptr_CPDDiscreteInterface[2])(pCVar1,uVar4,(ulong)IVar2);
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4] = extraout_XMM0_Qa;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetYProbabilitiesExactScopes( 
                    const vector<Index>& Xii,
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const Index& yIndex
                ) const
{
    size_t nrVals = _m_madp->GetNrValuesForFactor(yIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointYiiIndices(yIndex, Xii, Aii, Yii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_Y_CPDs[yIndex]->Get(valI, iiI);
    }
    return(probs);
}